

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void Elimination(Grammer *g)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  ulong uVar4;
  key_type *pkVar5;
  ulong uVar6;
  char *pcVar7;
  mapped_type *pmVar8;
  reference ppVar9;
  ostream *poVar10;
  _Self local_368;
  _Base_ptr local_360;
  _Base_ptr local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [8];
  string tmp2;
  string local_290 [32];
  string local_270 [32];
  _Self local_250;
  char local_241;
  _Self local_240;
  undefined4 local_234;
  char local_22d;
  int j;
  string local_228 [3];
  char replace;
  string tmp_1;
  int local_204;
  string local_200 [4];
  int i_1;
  string t1;
  int t_1;
  int flag;
  _Base_ptr local_1d0;
  _Rb_tree_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  iterator it;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [32];
  string local_138 [32];
  string local_118 [36];
  int local_f4;
  iterator iStack_f0;
  int t;
  _Self local_e8;
  int local_e0;
  int i;
  _Self local_d0;
  _Base_ptr local_c8;
  string local_c0 [8];
  string result;
  string local_a0 [8];
  string sub_string3;
  string local_80 [8];
  string sub_string2;
  string local_60 [8];
  string sub_string1;
  string local_40 [8];
  string tmp;
  _Rb_tree_const_iterator<char> local_20;
  iterator it2;
  iterator it1;
  Grammer *g_local;
  
  std::_Rb_tree_const_iterator<char>::_Rb_tree_const_iterator(&it2);
  std::_Rb_tree_const_iterator<char>::_Rb_tree_const_iterator(&local_20);
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  std::__cxx11::string::string(local_80);
  std::__cxx11::string::string(local_a0);
  std::__cxx11::string::string(local_c0);
  local_c8 = (_Base_ptr)std::set<char,_std::less<char>,_std::allocator<char>_>::begin(&g->Vt);
  it2 = (iterator)local_c8;
  while( true ) {
    local_d0._M_node =
         (_Base_ptr)std::set<char,_std::less<char>,_std::allocator<char>_>::end(&g->Vt);
    bVar2 = std::operator!=(&it2,&local_d0);
    if (!bVar2) break;
    pcVar3 = std::_Rb_tree_const_iterator<char>::operator*(&it2);
    pmVar8 = std::
             map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&g->grammer_map,pcVar3);
    std::__cxx11::string::operator=(local_40,(string *)pmVar8);
    for (local_e0 = 0; uVar6 = (ulong)local_e0, uVar4 = std::__cxx11::string::length(),
        uVar6 < uVar4; local_e0 = local_e0 + 1) {
      pkVar5 = (key_type *)std::__cxx11::string::operator[]((ulong)local_40);
      local_e8._M_node =
           (_Base_ptr)
           std::
           map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&g->grammer_map,pkVar5);
      iStack_f0 = std::
                  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(&g->grammer_map);
      bVar2 = std::operator!=(&local_e8,&stack0xffffffffffffff10);
      if (bVar2) {
        local_f4 = local_e0;
        while (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar7 != '|') {
          local_f4 = local_f4 + 1;
        }
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_118,(ulong)local_40);
        std::__cxx11::string::operator=(local_60,local_118);
        std::__cxx11::string::~string(local_118);
        std::__cxx11::string::substr((ulong)local_138,(ulong)local_40);
        std::__cxx11::string::operator=(local_80,local_138);
        std::__cxx11::string::~string(local_138);
        pkVar5 = (key_type *)std::__cxx11::string::operator[]((ulong)local_40);
        pmVar8 = std::
                 map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&g->grammer_map,pkVar5);
        std::__cxx11::string::operator=(local_a0,(string *)pmVar8);
        std::__cxx11::string::string(local_198,local_a0);
        std::__cxx11::string::string(local_1b8,local_80);
        substitution(local_178,(string *)local_198);
        std::operator+(local_158,local_178);
        std::__cxx11::string::operator=(local_c0,(string *)local_158);
        std::__cxx11::string::~string((string *)local_158);
        std::__cxx11::string::~string((string *)local_178);
        std::__cxx11::string::~string(local_1b8);
        std::__cxx11::string::~string(local_198);
        pcVar3 = std::_Rb_tree_const_iterator<char>::operator*(&it2);
        pmVar8 = std::
                 map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&g->grammer_map,pcVar3);
        std::__cxx11::string::operator=((string *)pmVar8,local_c0);
      }
    }
    it._M_node = (_Base_ptr)std::_Rb_tree_const_iterator<char>::operator++(&it2,0);
  }
  std::
  _Rb_tree_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_iterator(&local_1c8);
  local_1d0 = (_Base_ptr)
              std::
              map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin(&g->grammer_map);
  local_1c8._M_node = local_1d0;
  do {
    _t_1 = std::
           map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&g->grammer_map);
    bVar2 = std::operator!=(&local_1c8,(_Self *)&t_1);
    if (!bVar2) {
      local_360 = (_Base_ptr)
                  std::
                  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::begin(&g->grammer_map);
      local_1c8._M_node = local_360;
      while( true ) {
        local_368._M_node =
             (_Base_ptr)
             std::
             map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(&g->grammer_map);
        bVar2 = std::operator!=(&local_1c8,&local_368);
        if (!bVar2) break;
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&local_1c8);
        poVar10 = std::operator<<((ostream *)&std::cout,ppVar9->first);
        poVar10 = std::operator<<(poVar10,"->");
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&local_1c8);
        poVar10 = std::operator<<(poVar10,(string *)&ppVar9->second);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::
        _Rb_tree_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&local_1c8,0);
      }
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
      return;
    }
    bVar2 = false;
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&local_1c8);
    std::__cxx11::string::string(local_200,(string *)&ppVar9->second);
    for (local_204 = 0; uVar6 = std::__cxx11::string::length(), (ulong)(long)local_204 < uVar6;
        local_204 = local_204 + 1) {
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_200);
      if (*pcVar7 == '|') {
        std::__cxx11::string::substr((ulong)local_228,(ulong)local_200);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_200);
        cVar1 = *pcVar7;
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&local_1c8);
        if (cVar1 == ppVar9->first) {
          bVar2 = true;
          j = 0xd;
        }
        else {
          j = 0;
        }
        std::__cxx11::string::~string(local_228);
        if (j != 0) break;
      }
    }
    if (bVar2) {
      do {
        local_234 = 1;
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&local_1c8);
        local_241 = (char)*(undefined4 *)ppVar9 + (char)local_234;
        local_240._M_node =
             (_Base_ptr)
             std::
             map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&g->grammer_map,&local_241);
        local_250._M_node =
             (_Base_ptr)
             std::
             map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(&g->grammer_map);
        bVar2 = std::operator==(&local_240,&local_250);
      } while (!bVar2);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&local_1c8);
      local_22d = ppVar9->first + (char)local_234;
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_270,(ulong)local_200);
      std::__cxx11::string::operator=(local_60,local_270);
      std::__cxx11::string::~string(local_270);
      std::__cxx11::string::substr((ulong)local_290,(ulong)local_200);
      std::__cxx11::string::operator=(local_80,local_290);
      std::__cxx11::string::~string(local_290);
      std::__cxx11::string::string(local_2b0);
      std::__cxx11::string::push_back((char)local_2b0);
      std::__cxx11::string::string(local_2f0,local_60);
      std::__cxx11::string::string(local_310,local_2b0);
      substitution(local_2d0,(string *)local_2f0);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&local_1c8);
      pmVar8 = std::
               map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&g->grammer_map,&ppVar9->first);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)local_2d0);
      std::__cxx11::string::~string((string *)local_2d0);
      std::__cxx11::string::~string(local_310);
      std::__cxx11::string::~string(local_2f0);
      std::operator+(local_350,(char)local_80);
      std::operator+(local_330,(char *)local_350);
      std::__cxx11::string::operator=(local_c0,(string *)local_330);
      std::__cxx11::string::~string((string *)local_330);
      std::__cxx11::string::~string((string *)local_350);
      pmVar8 = std::
               map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&g->grammer_map,&local_22d);
      std::__cxx11::string::operator=((string *)pmVar8,local_c0);
      std::__cxx11::string::~string(local_2b0);
    }
    std::__cxx11::string::~string(local_200);
    local_358 = (_Base_ptr)
                std::
                _Rb_tree_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator++(&local_1c8,0);
  } while( true );
}

Assistant:

void Elimination(Grammer g)
{
    //代入
    set<char>::iterator it1, it2;
    string tmp,sub_string1,sub_string2, sub_string3,result;
    for (it1 = g.Vt.begin(); it1 != g.Vt.end(); it1++)
    {
        tmp = g.grammer_map[*it1];
        for (int i = 0; i < tmp.length(); i++)
        {
            if (g.grammer_map.find(tmp[i]) != g.grammer_map.end())//有没有相应的非终结符
            {
                int t=i;//用来定位|的位置
                while (tmp[t] != '|')
                    t++;
                sub_string1 = tmp.substr(t, tmp.length() - t);
                sub_string2 = tmp.substr(i+1,t-i-1);
                sub_string3 = g.grammer_map[tmp[i]];
                result = substitution(sub_string3, sub_string2) + sub_string1;
                g.grammer_map[*it1] = result;
            }
        }
    }
    //消除左递归
    map<char, string>::iterator it;
    for (it = g.grammer_map.begin(); it != g.grammer_map.end(); it++)
    {
        int flag = false;//是否出现左递归的标志
        int t = 0;
        string t1 = (*it).second;
        //t是非终结符的位置，i是‘|’的位置
        int i;
        for (i = 0; i < t1.length(); i++)
        {
            if (t1[i] == '|')
            {
                string tmp = t1.substr(t, i - t);
                if (t1[0] == (*it).first)//出现了左递归
                {
                    flag = true;
                    break;
                }
                t = i + 1;
            }
        }
        if (flag)
        {
            char replace;
            while (1)
            {
                int j = 1;
                if (g.grammer_map.find((*it).first + j) == g.grammer_map.end())
                {
                    replace = (*it).first + j;
                    break;
                }
                j++;
            }
            //t是非终结符的位置，i是‘|’的位置
            sub_string1 = t1.substr(i + 1, t1.length() - i);//后半部分
            sub_string2 = t1.substr(t + 1, i - t - 1);
            string tmp2;
            tmp2.push_back(replace);
            g.grammer_map[(*it).first] = substitution(sub_string1, tmp2);
            result = sub_string2 + replace + "|@";
            g.grammer_map[replace] = result;
        }
    }
    //map<char, string>::iterator it;
    for (it = g.grammer_map.begin(); it != g.grammer_map.end(); it++)
    {
        cout << (*it).first << "->" << (*it).second << endl;
    }
}